

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.cc
# Opt level: O0

void __thiscall Decoder::start(Decoder *this)

{
  native_handle_type __target_thread;
  thread *in_RDI;
  type *in_stack_00000008;
  thread *in_stack_00000010;
  thread *in_stack_ffffffffffffffd8;
  
  std::thread::thread<Decoder::start()::__0,,void>(in_stack_00000010,in_stack_00000008);
  std::thread::operator=(in_RDI,in_stack_ffffffffffffffd8);
  std::thread::~thread((thread *)0x18b2c4);
  __target_thread = std::thread::native_handle(in_RDI + 3);
  pthread_setname_np(__target_thread,"decoder");
  return;
}

Assistant:

void Decoder::start() {
  thread_ = std::thread([&] {
      std::array<uint8_t, 892> buf;
      decoder::Packetizer::Details details;
      while (packetizer_->nextPacket(buf, &details)) {
        if (details.ok && packetPublisher_) {
          packetPublisher_->publish(buf);
        }
        publishStats(details);
      }
    });
#ifdef __APPLE__
  pthread_setname_np("decoder");
#else
  pthread_setname_np(thread_.native_handle(), "decoder");
#endif
}